

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcCom.c
# Opt level: O3

int Abc_CommandInvPs(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Wlc_Ntk_t *pNtk;
  int iVar1;
  Vec_Int_t *vCounts;
  uint fVerbose;
  char *pcVar2;
  
  pNtk = (Wlc_Ntk_t *)pAbc->pAbcWlc;
  fVerbose = 0;
  Extra_UtilGetoptReset();
  while (iVar1 = Extra_UtilGetopt(argc,argv,"vh"), iVar1 == 0x76) {
    fVerbose = fVerbose ^ 1;
  }
  if (iVar1 == -1) {
    if (pNtk == (Wlc_Ntk_t *)0x0) {
      pcVar2 = "Abc_CommandInvPs(): There is no current design.\n";
    }
    else {
      if (pAbc->pAbcWlcInv != (Vec_Int_t *)0x0) {
        vCounts = Pdr_InvCounts(pAbc->pAbcWlcInv);
        Wlc_NtkPrintInvStats(pNtk,vCounts,fVerbose);
        if (vCounts->pArray != (int *)0x0) {
          free(vCounts->pArray);
        }
        free(vCounts);
        return 0;
      }
      pcVar2 = "Abc_CommandInvPs(): Invariant is not available.\n";
    }
    iVar1 = 0;
    Abc_Print(1,pcVar2);
  }
  else {
    Abc_Print(-2,"usage: inv_ps [-vh]\n");
    Abc_Print(-2,"\t         prints statistics for inductive invariant\n");
    Abc_Print(-2,"\t         (in the case of \'sat\' or \'undecided\', inifity clauses are used)\n")
    ;
    pcVar2 = "yes";
    if (fVerbose == 0) {
      pcVar2 = "no";
    }
    Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar2);
    Abc_Print(-2,"\t-h     : print the command usage\n");
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int Abc_CommandInvPs( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Vec_Int_t * Pdr_InvCounts( Vec_Int_t * vInv );
    extern void Wlc_NtkPrintInvStats( Wlc_Ntk_t * pNtk, Vec_Int_t * vInv, int fVerbose );
    Wlc_Ntk_t * pNtk = Wlc_AbcGetNtk(pAbc);
    Vec_Int_t * vCounts;
    int c, fVerbose  = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "vh" ) ) != EOF )
    {
        switch ( c )
        {
            case 'v':
                fVerbose ^= 1;
                break;
            case 'h':
                goto usage;
            default:
                goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( 1, "Abc_CommandInvPs(): There is no current design.\n" );
        return 0;
    }
    if ( Wlc_AbcGetInv(pAbc) == NULL )
    {
        Abc_Print( 1, "Abc_CommandInvPs(): Invariant is not available.\n" );
        return 0;
    }
    vCounts = Pdr_InvCounts( Wlc_AbcGetInv(pAbc) );
    Wlc_NtkPrintInvStats( pNtk, vCounts, fVerbose );
    Vec_IntFree( vCounts );
    return 0;
usage:
    Abc_Print( -2, "usage: inv_ps [-vh]\n" );
    Abc_Print( -2, "\t         prints statistics for inductive invariant\n" );
    Abc_Print( -2, "\t         (in the case of \'sat\' or \'undecided\', inifity clauses are used)\n" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}